

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O2

bool __thiscall
cmUuid::StringToBinary
          (cmUuid *this,string *input,vector<unsigned_char,_std::allocator<unsigned_char>_> *output)

{
  int iVar1;
  pointer puVar2;
  pointer piVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  string local_50;
  
  puVar2 = (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (output->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(output,0x10);
  if (input->_M_string_length == 0x24) {
    uVar6 = 0;
    lVar5 = 0;
    while( true ) {
      piVar3 = (this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar7 = (ulong)((long)(this->Groups).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar6;
      if (bVar7) break;
      if (uVar6 != 0) {
        if ((input->_M_dataplus)._M_p[lVar5] != '-') {
          return bVar7;
        }
        lVar5 = lVar5 + 1;
      }
      iVar1 = piVar3[uVar6];
      std::__cxx11::string::substr((ulong)&local_50,(ulong)input);
      bVar4 = StringToBinaryImpl(this,&local_50,output);
      std::__cxx11::string::~string((string *)&local_50);
      if (!bVar4) {
        return bVar7;
      }
      lVar5 = lVar5 + (long)iVar1 * 2;
      uVar6 = uVar6 + 1;
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool cmUuid::StringToBinary(std::string const& input,
  std::vector<unsigned char> &output) const
{
  output.clear();
  output.reserve(16);

  if(input.length() != 36)
    {
    return false;
    }
  size_t index = 0;
  for(size_t i = 0; i < this->Groups.size(); ++i)
    {
    if(i != 0 && input[index++] != '-')
      {
      return false;
      }
    size_t digits = this->Groups[i] * 2;
    if(!StringToBinaryImpl(input.substr(index, digits), output))
      {
      return false;
      }

    index += digits;
    }

  return true;
}